

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

void TPZCompElHCurl<pzshape::TPZShapePrism>::TransformCurl<3>
               (TPZFMatrix<double> *curlphiref,REAL detjac,TPZFMatrix<double> *jacobian,
               TPZFMatrix<double> *curlphi)

{
  TPZFMatrix<double> local_a0;
  
  TPZFMatrix<double>::operator*(&local_a0,jacobian,curlphiref);
  TPZFMatrix<double>::operator=(curlphi,&local_a0);
  TPZFMatrix<double>::~TPZFMatrix(&local_a0);
  (*(curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x26])
            (1.0 / detjac,curlphi);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::TransformCurl(const TPZFMatrix<REAL> &curlphiref,
                                           const REAL detjac,
                                           const TPZFMatrix<REAL> &jacobian,
                                           TPZFMatrix<REAL> &curlphi)
{
    if constexpr(TDIM==3){
        curlphi = jacobian * curlphiref;
        curlphi *= 1./detjac;
    }else {
        curlphi = curlphiref;
        curlphi *= 1./detjac;
    }
}